

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexSeparableKernel::adjustSubfaceToMain(PtexSeparableKernel *this,int eid)

{
  int iVar1;
  uint in_ESI;
  Res *in_RDI;
  
  switch(in_ESI & 3) {
  case 0:
    iVar1 = Res::v(in_RDI);
    *(int *)(in_RDI + 4) = iVar1 + *(int *)(in_RDI + 4);
    break;
  case 1:
    break;
  case 2:
    iVar1 = Res::u(in_RDI);
    *(int *)(in_RDI + 2) = iVar1 + *(int *)(in_RDI + 2);
    break;
  case 3:
    iVar1 = Res::u(in_RDI);
    *(int *)(in_RDI + 2) = iVar1 + *(int *)(in_RDI + 2);
    iVar1 = Res::v(in_RDI);
    *(int *)(in_RDI + 4) = iVar1 + *(int *)(in_RDI + 4);
  }
  in_RDI->ulog2 = in_RDI->ulog2 + '\x01';
  in_RDI->vlog2 = in_RDI->vlog2 + '\x01';
  return;
}

Assistant:

void adjustSubfaceToMain(int eid)
    {
        switch (eid&3) {
        case e_bottom: v += res.v(); break;
        case e_right:  break;
        case e_top:    u += res.u(); break;
        case e_left:   u += res.u(); v += res.v(); break;
        }
        res.ulog2++; res.vlog2++;
    }